

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

uint64_t __thiscall jbcoin::SerialIter::get64(SerialIter *this)

{
  byte *pbVar1;
  
  if (7 < this->remain_) {
    pbVar1 = this->p_;
    this->p_ = pbVar1 + 8;
    this->used_ = this->used_ + 8;
    this->remain_ = this->remain_ - 8;
    return (ulong)pbVar1[7] +
           ((ulong)pbVar1[6] << 8 |
           (ulong)pbVar1[5] << 0x10 |
           (ulong)pbVar1[4] << 0x18 |
           (ulong)pbVar1[3] << 0x20 |
           (ulong)pbVar1[2] << 0x28 | (ulong)pbVar1[1] << 0x30 | (ulong)*pbVar1 << 0x38);
  }
  Throw<std::runtime_error,char_const(&)[25]>((char (*) [25])"invalid SerialIter get64");
}

Assistant:

std::uint64_t
SerialIter::get64 ()
{
    if (remain_ < 8)
        Throw<std::runtime_error> (
            "invalid SerialIter get64");
    auto t = p_;
    p_ += 8;
    used_ += 8;
    remain_ -= 8;
    return
        (std::uint64_t(t[0]) << 56) +
        (std::uint64_t(t[1]) << 48) +
        (std::uint64_t(t[2]) << 40) +
        (std::uint64_t(t[3]) << 32) +
        (std::uint64_t(t[4]) << 24) +
        (std::uint64_t(t[5]) << 16) +
        (std::uint64_t(t[6]) <<  8) +
         std::uint64_t(t[7] );
}